

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void ungroup_objects_sel_repeat_proc(Am_Object *command_obj)

{
  Am_Value *initial;
  Am_Value new_sel;
  Am_Value local_30;
  Am_Value local_20;
  
  initial = Am_Object::Get(command_obj,0x16d,0);
  Am_Value::Am_Value(&local_20,initial);
  Am_Value::Am_Value(&local_30,&local_20);
  ungroup_new_objs(command_obj,&local_30);
  Am_Value::~Am_Value(&local_30);
  Am_Value::~Am_Value(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, ungroup_objects_sel_repeat,
                 (Am_Object command_obj))
{
  Am_Value new_sel = command_obj.Get(Am_OBJECT_MODIFIED);
  ungroup_new_objs(command_obj, new_sel);
}